

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool tinygltf::ParseNumberProperty
               (double *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  double dVar1;
  bool bVar2;
  reference this;
  json_const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  json_const_iterator local_48;
  
  local_48.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_48.m_object = (pointer)0x0;
  local_48.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_48.m_it.primitive_iterator.m_it = -0x8000000000000000;
  bVar2 = anon_unknown_57::FindMember(o,(property->_M_dataplus)._M_p,&local_48);
  if (bVar2) {
    this = nlohmann::detail::
           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator*(&local_48);
    if (this->m_type == number_float) {
      dVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<double,_double,_0>(this);
      if (ret == (double *)0x0) {
        return true;
      }
      *ret = dVar1;
      return true;
    }
    if (required && err != (string *)0x0) {
      std::operator+(&local_68,"\'",property);
      std::operator+(&bStack_88,&local_68,"\' property is not a number type.\n");
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&bStack_88);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  else if (required && err != (string *)0x0) {
    std::operator+(&local_68,"\'",property);
    std::operator+(&bStack_88,&local_68,"\' property is missing");
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::~string((string *)&bStack_88);
    std::__cxx11::string::~string((string *)&local_68);
    if (parent_node->_M_string_length != 0) {
      std::operator+(&bStack_88," in ",parent_node);
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&bStack_88);
    }
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

static bool ParseNumberProperty(double *ret, std::string *err, const json &o,
                                const std::string &property,
                                const bool required,
                                const std::string &parent_node = "") {
  json_const_iterator it;

  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  double doubleValue;
  bool isDouble = GetDouble(GetValue(it), doubleValue);

  if (!isDouble) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not a number type.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = doubleValue;
  }

  return true;
}